

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O1

void __thiscall ki::protocol::net::Session::Session(Session *this,uint16_t id)

{
  rep rVar1;
  
  this->_vptr_Session = (_func_int **)&PTR__Session_0018b7f0;
  (this->m_creation_time).__d.__r = 0;
  (this->m_connection_time).__d.__r = 0;
  (this->m_establish_time).__d.__r = 0;
  (this->m_last_received_heartbeat_time).__d.__r = 0;
  (this->m_last_sent_heartbeat_time).__d.__r = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)&this->m_data_stream);
  this->m_id = id;
  this->m_established = false;
  this->m_access_level = '\0';
  this->m_latency = 0;
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->m_creation_time).__d.__r = rVar1;
  this->m_waiting_for_keep_alive_response = false;
  this->m_maximum_packet_size = 0x2000;
  this->m_receive_state = WAITING_FOR_START_SIGNAL;
  this->m_start_signal = 0;
  this->m_incoming_packet_size = 0;
  this->m_shift = '\0';
  return;
}

Assistant:

Session::Session(const uint16_t id)
	{
		m_id = id;
		m_established = false;
		m_access_level = 0;
		m_latency = 0;
		m_creation_time = std::chrono::steady_clock::now();
		m_waiting_for_keep_alive_response = false;

		m_maximum_packet_size = KI_DEFAULT_MAXIMUM_RECEIVE_SIZE;
		m_receive_state = ReceiveState::WAITING_FOR_START_SIGNAL;
		m_start_signal = 0;
		m_incoming_packet_size = 0;
		m_shift = 0;
	}